

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdKelvinPolygonOffsetFactor::emulate_mthd(MthdKelvinPolygonOffsetFactor *this)

{
  pgraph_state *state;
  uint32_t val;
  _Bool _Var1;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = pgraph_in_begin_end(state);
  if (_Var1) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  val = (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_polygon_offset_factor = val
  ;
  pgraph_bundle(state,0x3f,0,val,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				exp.bundle_polygon_offset_factor = val;
				pgraph_bundle(&exp, BUNDLE_POLYGON_OFFSET_FACTOR, 0, exp.bundle_polygon_offset_factor, true);
			}
		}
	}